

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall FIX::Initiator::stop(Initiator *this,bool force)

{
  Mutex *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Session *pSVar3;
  pointer ppSVar4;
  int iVar5;
  undefined7 in_register_00000031;
  Locker l;
  bool bVar6;
  allocator<char> local_b5;
  undefined4 local_b4;
  Session *pSession;
  vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> enabledSessions;
  SessionIDs connected;
  string local_50;
  
  if (this->m_stop == false) {
    local_b4 = (undefined4)CONCAT71(in_register_00000031,force);
    HttpServer::stopGlobal();
    enabledSessions.super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = &connected._M_t._M_impl.super__Rb_tree_header;
    connected._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    connected._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    enabledSessions.super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    enabledSessions.super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    connected._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->m_mutex;
    connected._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    connected._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    Mutex::lock(this_00);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::operator=(&connected._M_t,&(this->m_connected)._M_t);
    Mutex::unlock(this_00);
    for (p_Var2 = connected._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      pSession = Session::lookupSession((SessionID *)(p_Var2 + 1));
      if ((pSession != (Session *)0x0) && ((pSession->m_state).m_enabled == true)) {
        std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::push_back
                  (&enabledSessions,&pSession);
        pSVar3 = pSession;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_b5);
        Session::logout(pSVar3,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if ((char)local_b4 == '\0') {
      iVar5 = 10;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        bVar6 = isLoggedOn(this);
        if (!bVar6) break;
        process_sleep(1.0);
      }
    }
    Mutex::lock(this_00);
    for (p_Var2 = connected._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      pSVar3 = Session::lookupSession((SessionID *)(p_Var2 + 1));
      setDisconnected(this,&pSVar3->m_sessionID);
    }
    Mutex::unlock(this_00);
    this->m_stop = true;
    (*this->_vptr_Initiator[6])(this);
    if (this->m_threadid != 0) {
      thread_join(this->m_threadid);
    }
    this->m_threadid = 0;
    for (ppSVar4 = enabledSessions.
                   super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppSVar4 !=
        enabledSessions.super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
      Session::logon(*ppSVar4);
    }
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&connected._M_t);
    std::_Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>::~_Vector_base
              (&enabledSessions.super__Vector_base<FIX::Session_*,_std::allocator<FIX::Session_*>_>)
    ;
  }
  return;
}

Assistant:

void Initiator::stop( bool force )
{
  if( isStopped() ) return;

  HttpServer::stopGlobal();

  std::vector<Session*> enabledSessions;

  SessionIDs connected;

  {
    Locker l(m_mutex);
    connected = m_connected;
  }

  SessionIDs::iterator i = connected.begin();
  for ( ; i != connected.end(); ++i )
  {
    Session* pSession = Session::lookupSession(*i);
    if( pSession && pSession->isEnabled() )
    {
      enabledSessions.push_back( pSession );
      pSession->logout();
    }
  }

  if( !force )
  {
    for ( int second = 1; second <= 10 && isLoggedOn(); ++second )
      process_sleep( 1 );
  }

  {
    Locker l(m_mutex);
    for ( i = connected.begin(); i != connected.end(); ++i )
      setDisconnected( Session::lookupSession(*i)->getSessionID() );
  }

  m_stop = true;
  onStop();
  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;

  std::vector<Session*>::iterator session = enabledSessions.begin();
  for( ; session != enabledSessions.end(); ++session )
    (*session)->logon();
}